

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_state.cpp
# Opt level: O1

uint32_t __thiscall
spvtools::val::ValidationState_t::GetOperandTypeId
          (ValidationState_t *this,Instruction *inst,size_t operand_index)

{
  uint id;
  uint32_t uVar1;
  Instruction *pIVar2;
  
  id = Instruction::GetOperandAs<unsigned_int>(inst,operand_index);
  pIVar2 = FindDef(this,id);
  if (pIVar2 == (Instruction *)0x0) {
    uVar1 = 0;
  }
  else {
    uVar1 = (pIVar2->inst_).type_id;
  }
  return uVar1;
}

Assistant:

uint32_t ValidationState_t::GetOperandTypeId(const Instruction* inst,
                                             size_t operand_index) const {
  return GetTypeId(inst->GetOperandAs<uint32_t>(operand_index));
}